

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O2

VmConstant * CreateConstantDouble(Allocator *allocator,SynBase *source,double value)

{
  int iVar1;
  undefined4 extraout_var;
  VmConstant *this;
  
  iVar1 = (*allocator->_vptr_Allocator[2])(allocator,0xd8);
  this = (VmConstant *)CONCAT44(extraout_var,iVar1);
  VmConstant::VmConstant(this,allocator,(VmType)ZEXT816((ulong)0x800000002),source);
  this->dValue = value;
  return this;
}

Assistant:

VmConstant* CreateConstantDouble(Allocator *allocator, SynBase *source, double value)
{
	VmConstant *result = new (get<VmConstant>(allocator)) VmConstant(allocator, VmType::Double, source);

	result->dValue = value;

	return result;
}